

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,BYTE *iend,
                 size_t *offsetPtr,U32 mls,U32 extDict)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong *puVar19;
  char cVar20;
  uint uVar21;
  int iVar22;
  ulong *puVar23;
  BYTE *pBVar24;
  uint *puVar25;
  long lVar26;
  ulong *puVar27;
  uint *puVar28;
  BYTE *pInLoopLimit_1;
  U32 *pUVar29;
  uint uVar30;
  uint *puVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  uint uVar37;
  BYTE *pBVar38;
  uint uVar39;
  BYTE *pInLoopLimit;
  U32 dummy32_1;
  U32 dummy32;
  U32 *bt;
  uint *local_128;
  BYTE *local_108;
  ulong local_d8;
  uint local_c8;
  uint local_70;
  uint local_6c;
  U32 *local_68;
  ulong *local_60;
  ZSTD_compressionParameters *local_58;
  U32 *local_50;
  ulong local_48;
  BYTE *local_40;
  BYTE *local_38;
  
  local_68 = ms->hashTable;
  cVar20 = (char)cParams->hashLog;
  switch(mls) {
  case 5:
    lVar26 = -0x30e4432345000000;
    break;
  case 6:
    lVar26 = -0x30e4432340650000;
    break;
  case 7:
    lVar26 = -0x30e44323405a9d00;
    break;
  case 8:
    lVar26 = -0x30e44323485a9b9d;
    break;
  default:
    uVar36 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar20 & 0x1fU));
    goto LAB_0019a498;
  }
  uVar36 = (ulong)(lVar26 * *(long *)ip) >> (-cVar20 & 0x3fU);
LAB_0019a498:
  pBVar5 = (ms->window).base;
  uVar32 = (int)ip - (int)pBVar5;
  uVar1 = (ms->window).lowLimit;
  uVar34 = ~(-1 << ((char)cParams->chainLog - 1U & 0x1f));
  uVar15 = 0;
  uVar21 = uVar32 - uVar34;
  if (uVar32 < uVar34) {
    uVar21 = 0;
  }
  uVar4 = uVar1;
  if (uVar1 < uVar21) {
    uVar4 = uVar21;
  }
  local_c8 = 1 << ((byte)cParams->searchLog & 0x1f);
  pUVar29 = ms->chainTable;
  uVar30 = local_68[uVar36];
  uVar37 = local_c8;
  local_60 = offsetPtr;
  local_58 = cParams;
  local_50 = pUVar29;
  if (uVar4 < uVar30) {
    do {
      uVar14 = (ulong)uVar30;
      uVar16 = (ulong)((uVar30 & uVar34) * 2);
      if ((pUVar29[uVar16 + 1] != 1) || (uVar37 < 2)) {
        if (pUVar29[uVar16 + 1] == 1) {
          (pUVar29 + uVar16)[0] = 0;
          (pUVar29 + uVar16)[1] = 0;
        }
        uVar14 = uVar15;
        if ((U32)uVar15 == 0) goto LAB_0019a92b;
        break;
      }
      pUVar29[uVar16 + 1] = (U32)uVar15;
      uVar37 = uVar37 - 1;
      uVar30 = pUVar29[uVar16];
      uVar15 = uVar14;
    } while (uVar4 < uVar30);
    local_108 = (ms->window).dictBase;
    local_48 = uVar36;
    do {
      uVar9 = (uint)uVar14;
      uVar30 = (ms->window).dictLimit;
      uVar36 = (ulong)uVar30;
      puVar23 = (ulong *)iend;
      pBVar38 = pBVar5;
      if (uVar9 < uVar30) {
        puVar23 = (ulong *)(local_108 + uVar36);
        pBVar38 = local_108;
      }
      uVar2 = pUVar29[(ulong)((uVar9 & uVar34) * 2) + 1];
      uVar33 = ~(-1 << ((char)local_58->chainLog - 1U & 0x1f));
      uVar15 = (ulong)((uVar9 & uVar33) * 2);
      puVar31 = pUVar29 + uVar15;
      puVar28 = pUVar29 + uVar15 + 1;
      if (uVar37 != 0) {
        uVar39 = pUVar29[uVar15];
        uVar3 = (ms->window).lowLimit;
        if (uVar3 < uVar39) {
          local_38 = pBVar5 + uVar36;
          local_40 = pBVar38 + uVar14 + 8;
          uVar16 = 0;
          uVar15 = 0;
          uVar35 = uVar37;
          do {
            uVar11 = uVar15;
            if (uVar16 < uVar15) {
              uVar11 = uVar16;
            }
            uVar18 = (ulong)uVar39;
            pBVar24 = pBVar5;
            if (extDict == 0) {
LAB_0019a75a:
              puVar27 = (ulong *)(pBVar38 + uVar11 + uVar14);
              puVar19 = (ulong *)(pBVar24 + uVar18 + uVar11);
              puVar13 = puVar27;
              if (puVar27 < (ulong *)((long)puVar23 - 7U)) {
                if (*puVar19 == *puVar27) {
                  lVar26 = 0;
                  do {
                    puVar13 = (ulong *)(local_40 + lVar26 + uVar11);
                    if ((ulong *)((long)puVar23 - 7U) <= puVar13) {
                      puVar19 = (ulong *)(pBVar24 + lVar26 + uVar18 + uVar11 + 8);
                      goto LAB_0019a807;
                    }
                    lVar8 = lVar26 + uVar18 + uVar11 + 8;
                    lVar26 = lVar26 + 8;
                  } while (*(ulong *)(pBVar24 + lVar8) == *puVar13);
                  uVar12 = *puVar13 ^ *(ulong *)(pBVar24 + lVar8);
                  uVar17 = 0;
                  if (uVar12 != 0) {
                    for (; (uVar12 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  uVar17 = (uVar17 >> 3 & 0x1fffffff) + lVar26;
                }
                else {
                  uVar12 = *puVar27 ^ *puVar19;
                  uVar17 = 0;
                  if (uVar12 != 0) {
                    for (; (uVar12 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  uVar17 = uVar17 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0019a807:
                if ((puVar13 < (ulong *)((long)puVar23 - 3U)) && ((int)*puVar19 == (int)*puVar13)) {
                  puVar13 = (ulong *)((long)puVar13 + 4);
                  puVar19 = (ulong *)((long)puVar19 + 4);
                }
                if ((puVar13 < (ulong *)((long)puVar23 + -1)) &&
                   ((short)*puVar19 == (short)*puVar13)) {
                  puVar13 = (ulong *)((long)puVar13 + 2);
                  puVar19 = (ulong *)((long)puVar19 + 2);
                }
                if (puVar13 < puVar23) {
                  puVar13 = (ulong *)((long)puVar13 + (ulong)((byte)*puVar19 == (byte)*puVar13));
                }
                uVar17 = (long)puVar13 - (long)puVar27;
              }
              uVar11 = uVar17 + uVar11;
              pBVar24 = pBVar24 + uVar18;
            }
            else {
              if ((uVar9 < uVar30) || (uVar36 <= uVar11 + uVar18)) {
                if (uVar11 + uVar18 < uVar36) {
                  pBVar24 = local_108;
                }
                goto LAB_0019a75a;
              }
              sVar10 = ZSTD_count_2segments
                                 (pBVar38 + uVar11 + uVar14,local_108 + uVar18 + uVar11,
                                  (BYTE *)puVar23,local_108 + uVar36,local_38);
              uVar11 = sVar10 + uVar11;
              pBVar24 = pBVar5 + uVar18;
              pUVar29 = local_50;
              if (uVar11 + uVar18 < uVar36) {
                pBVar24 = local_108 + uVar18;
              }
            }
            if ((ulong *)(pBVar38 + uVar11 + uVar14) == puVar23) break;
            puVar25 = pUVar29 + (uVar39 & uVar33) * 2;
            if (pBVar24[uVar11] < (byte)*(ulong *)(pBVar38 + uVar11 + uVar14)) {
              *puVar31 = uVar39;
              if (uVar39 <= uVar4) {
                puVar31 = &local_6c;
                break;
              }
              puVar25 = puVar25 + 1;
              uVar16 = uVar11;
              puVar31 = puVar25;
            }
            else {
              *puVar28 = uVar39;
              puVar28 = puVar25;
              uVar15 = uVar11;
              if (uVar39 <= uVar4) {
                puVar28 = &local_6c;
                break;
              }
            }
            uVar35 = uVar35 - 1;
            if ((uVar35 == 0) || (uVar39 = *puVar25, uVar39 <= uVar3)) break;
          } while( true );
        }
      }
      *puVar28 = 0;
      *puVar31 = 0;
      uVar37 = uVar37 + 1;
      uVar14 = (ulong)uVar2;
      uVar36 = local_48;
    } while (uVar2 != 0);
  }
  else {
LAB_0019a92b:
    local_108 = (ms->window).dictBase;
  }
  uVar14 = (ulong)(ms->window).dictLimit;
  uVar15 = (ulong)((uVar34 & uVar32) * 2);
  local_128 = pUVar29 + uVar15;
  puVar31 = pUVar29 + uVar15 + 1;
  iVar22 = uVar32 + 9;
  uVar4 = local_68[uVar36];
  local_68[uVar36] = uVar32;
  if (uVar1 < uVar4) {
    uVar36 = 0;
    uVar15 = 0;
    local_d8 = 0;
    do {
      uVar11 = (ulong)uVar4;
      uVar16 = uVar15;
      if (local_d8 < uVar15) {
        uVar16 = local_d8;
      }
      uVar18 = uVar16 + uVar11;
      puVar23 = (ulong *)(ip + uVar16);
      if ((extDict == 0) || (uVar14 <= uVar18)) {
        puVar27 = (ulong *)(pBVar5 + uVar11 + uVar16);
        puVar19 = puVar23;
        if (puVar23 < iend + -7) {
          if (*puVar27 == *puVar23) {
            lVar26 = 0;
            do {
              puVar19 = (ulong *)(ip + lVar26 + uVar16 + 8);
              if (iend + -7 <= puVar19) {
                puVar27 = (ulong *)(pBVar5 + uVar18 + lVar26 + 8);
                goto LAB_0019ab1b;
              }
              lVar8 = lVar26 + uVar18 + 8;
              lVar26 = lVar26 + 8;
            } while (*(ulong *)(pBVar5 + lVar8) == *puVar19);
            uVar17 = *puVar19 ^ *(ulong *)(pBVar5 + lVar8);
            uVar18 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar18 = (uVar18 >> 3 & 0x1fffffff) + lVar26;
          }
          else {
            uVar17 = *puVar23 ^ *puVar27;
            uVar18 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar18 = uVar18 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_0019ab1b:
          if ((puVar19 < iend + -3) && ((int)*puVar27 == (int)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 4);
            puVar27 = (ulong *)((long)puVar27 + 4);
          }
          if ((puVar19 < iend + -1) && ((short)*puVar27 == (short)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 2);
            puVar27 = (ulong *)((long)puVar27 + 2);
          }
          if (puVar19 < iend) {
            puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar19));
          }
          uVar18 = (long)puVar19 - (long)puVar23;
        }
        uVar16 = uVar18 + uVar16;
        pBVar38 = pBVar5 + uVar11;
      }
      else {
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)puVar23,local_108 + uVar11 + uVar16,iend,local_108 + uVar14,
                            pBVar5 + uVar14);
        uVar16 = sVar10 + uVar16;
        pBVar38 = pBVar5 + uVar11;
        if (uVar16 + uVar11 < uVar14) {
          pBVar38 = local_108 + uVar11;
        }
      }
      if (uVar36 < uVar16) {
        iVar6 = uVar4 + (int)uVar16;
        if (uVar16 <= iVar22 - uVar4) {
          iVar6 = iVar22;
        }
        iVar22 = iVar6;
        uVar30 = (uVar32 + 1) - uVar4;
        iVar6 = 0x1f;
        if (uVar30 != 0) {
          for (; uVar30 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        uVar30 = (int)*local_60 + 1;
        iVar7 = 0x1f;
        if (uVar30 != 0) {
          for (; uVar30 >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        if (iVar6 - iVar7 < ((int)uVar16 - (int)uVar36) * 4) {
          *local_60 = (ulong)((uVar32 + 2) - uVar4);
          uVar36 = uVar16;
        }
        if (ip + uVar16 == iend) goto LAB_0019ac8e;
      }
      puVar28 = local_50 + (uVar4 & uVar34) * 2;
      if (pBVar38[uVar16] < ip[uVar16]) {
        *local_128 = uVar4;
        if (uVar4 <= uVar21) {
          local_128 = &local_70;
          goto LAB_0019ac8e;
        }
        puVar28 = puVar28 + 1;
        local_128 = puVar28;
        local_d8 = uVar16;
      }
      else {
        *puVar31 = uVar4;
        uVar15 = uVar16;
        puVar31 = puVar28;
        if (uVar4 <= uVar21) {
          puVar31 = &local_70;
          goto LAB_0019ac8e;
        }
      }
      local_c8 = local_c8 - 1;
      if ((local_c8 == 0) || (uVar4 = *puVar28, uVar4 <= uVar1)) goto LAB_0019ac8e;
    } while( true );
  }
  uVar36 = 0;
LAB_0019ac8e:
  *puVar31 = 0;
  *local_128 = 0;
  ms->nextToUpdate = iVar22 - 8;
  return uVar36;
}

Assistant:

static size_t ZSTD_DUBT_findBestMatch (
                            ZSTD_matchState_t* ms, ZSTD_compressionParameters const* cParams,
                            const BYTE* const ip, const BYTE* const iend,
                            size_t* offsetPtr,
                            U32 const mls,
                            U32 const extDict)
{
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const current = (U32)(ip-base);
    U32    const windowLow = ms->window.lowLimit;

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= current) ? 0 : current - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", current);
    assert(ip <= iend-8);   /* required for h calculation */

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;   /* nullify next candidate if it's still unsorted (note : simplification, detrimental to compression ratio, beneficial for speed) */
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, cParams, matchIndex, iend,
                         nbCandidates, unsortLimit, extDict);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller=0, commonLengthLarger=0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(current&btMask);
        U32* largerPtr  = bt + 2*(current&btMask) + 1;
        U32 matchEndIdx = current+8+1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = current;   /* Update Hash Table */

        while (nbCompares-- && (matchIndex > windowLow)) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((!extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(current-matchIndex+1) - ZSTD_highbit32((U32)offsetPtr[0]+1)) )
                    bestLength = matchLength, *offsetPtr = ZSTD_REP_MOVE + current - matchIndex;
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        assert(matchEndIdx > current+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = current - ((U32)*offsetPtr - ZSTD_REP_MOVE); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        current, (U32)bestLength, (U32)*offsetPtr, mIndex);
        }
        return bestLength;
    }
}